

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::sendAt
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,Time time)

{
  atomic<int> *paVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  string_view string3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar5;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  char *pcVar6;
  string_view message_00;
  string_view string2;
  size_t sStackY_140;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  ActionMessage message;
  
  ppVar5 = getHandleInfo(this,sourceHandle);
  if (ppVar5 == (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "handle is not valid";
    sStackY_140 = 0x13;
  }
  else {
    if (*(char *)((long)&(ppVar5->first)._M_string_length + 4) == 'e') {
      this_00 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar5->first)._M_string_length);
      FederateState::getMessageDestinations(&targets,this_00,sourceHandle);
      if (targets.
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          targets.
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ActionMessage::ActionMessage(&message,cmd_send_message);
        message.source_id.gid = *(BaseType *)&(ppVar5->first)._M_dataplus._M_p;
        lVar3 = (this_00->allowed_send_time).internalTimeCode;
        message.actionTime.internalTimeCode = time.internalTimeCode;
        if (time.internalTimeCode < lVar3) {
          message.actionTime.internalTimeCode = lVar3;
        }
        message.source_handle.hid = sourceHandle.hid;
        SmallBuffer::assign(&message.payload,data,length);
        LOCK();
        paVar1 = &this->messageCounter;
        iVar2 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        message.messageID = iVar2 + 1;
        pcVar6 = (char *)(ppVar5->first).field_2._M_allocated_capacity;
        sVar4 = *(size_t *)((long)&(ppVar5->first).field_2 + 8);
        string3._M_str = pcVar6;
        string3._M_len = sVar4;
        string2._M_str = pcVar6;
        string2._M_len = sVar4;
        ActionMessage::setStringData
                  (&message,(string_view)(ZEXT816(0x3b52e4) << 0x40),string2,string3);
        generateMessages(this,&message,&targets);
        ActionMessage::~ActionMessage(&message);
      }
      std::
      _Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::~_Vector_base(&targets.
                       super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     );
      return;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "handle does not point to an endpoint";
    sStackY_140 = 0x24;
  }
  message_00._M_str = pcVar6;
  message_00._M_len = sStackY_140;
  InvalidIdentifier::InvalidIdentifier(this_01,message_00);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::sendAt(InterfaceHandle sourceHandle, const void* data, uint64_t length, Time time)
{
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto targets = fed->getMessageDestinations(sourceHandle);
    if (targets.empty()) {
        return;
    }

    ActionMessage message(CMD_SEND_MESSAGE);
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    auto minTime = fed->nextAllowedSendTime();
    message.actionTime = std::max(time, minTime);
    message.payload.assign(data, length);
    message.messageID = ++messageCounter;
    message.setStringData("", hndl->key, hndl->key);
    generateMessages(message, targets);
}